

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::SetCommentInfo::SetCommentInfo
          (SetCommentInfo *this,CatalogType entry_catalog_type,string *entry_catalog_p,
          string *entry_schema_p,string *entry_name_p,Value *new_comment_value_p,
          OnEntryNotFound if_not_found)

{
  string local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)entry_catalog_p);
  ::std::__cxx11::string::string((string *)&local_70,(string *)entry_schema_p);
  ::std::__cxx11::string::string((string *)&local_90,(string *)entry_name_p);
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,SET_COMMENT,&local_50,&local_70,&local_90,if_not_found);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetCommentInfo_027a7a80;
  (this->super_AlterInfo).field_0x71 = entry_catalog_type;
  Value::Value(&this->comment_value,new_comment_value_p);
  return;
}

Assistant:

SetCommentInfo::SetCommentInfo(CatalogType entry_catalog_type, string entry_catalog_p, string entry_schema_p,
                               string entry_name_p, Value new_comment_value_p, OnEntryNotFound if_not_found)
    : AlterInfo(AlterType::SET_COMMENT, std::move(entry_catalog_p), std::move(entry_schema_p), std::move(entry_name_p),
                if_not_found),
      entry_catalog_type(entry_catalog_type), comment_value(std::move(new_comment_value_p)) {
}